

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O2

_Bool mi_heap_check_owned(mi_heap_t *heap,void *p)

{
  _Bool found;
  undefined1 local_9;
  
  if ((heap != (mi_heap_t *)0x0) && (((ulong)p & 7) == 0 && heap != &_mi_heap_empty)) {
    local_9 = 0;
    mi_heap_visit_pages(heap,mi_heap_page_check_owned,p,&local_9);
    return (_Bool)local_9;
  }
  return false;
}

Assistant:

bool mi_heap_check_owned(mi_heap_t* heap, const void* p) {
  mi_assert(heap != NULL);
  if (heap==NULL || !mi_heap_is_initialized(heap)) return false;
  if (((uintptr_t)p & (MI_INTPTR_SIZE - 1)) != 0) return false;  // only aligned pointers
  bool found = false;
  mi_heap_visit_pages(heap, &mi_heap_page_check_owned, (void*)p, &found);
  return found;
}